

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::duplicateRow
          (HighsPostsolveStack *this,HighsInt row,bool rowUpperTightened,bool rowLowerTightened,
          HighsInt duplicateRow,double duplicateRowScale)

{
  reference pvVar1;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  DuplicateRow *in_XMM0_Qa;
  value_type vVar2;
  value_type vVar3;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_R8D);
  vVar2 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)in_ESI);
  vVar3 = *pvVar1;
  HighsDataStack::push<presolve::HighsPostsolveStack::DuplicateRow,_0>
            ((HighsDataStack *)CONCAT44(vVar3,vVar2),in_XMM0_Qa);
  reductionAdded((HighsPostsolveStack *)CONCAT44(vVar3,vVar2),
                 (ReductionType)((ulong)in_XMM0_Qa >> 0x38));
  return;
}

Assistant:

void duplicateRow(HighsInt row, bool rowUpperTightened,
                    bool rowLowerTightened, HighsInt duplicateRow,
                    double duplicateRowScale) {
    reductionValues.push(
        DuplicateRow{duplicateRowScale, origRowIndex[duplicateRow],
                     origRowIndex[row], rowLowerTightened, rowUpperTightened});
    reductionAdded(ReductionType::kDuplicateRow);
  }